

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O1

void __thiscall
duckdb::WriteOverflowStringsToDisk::WriteString
          (WriteOverflowStringsToDisk *this,UncompressedStringSegmentState *state,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  BufferManager *pBVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  int iVar4;
  BlockManager *pBVar5;
  idx_t iVar6;
  undefined4 extraout_var;
  idx_t iVar7;
  undefined4 extraout_var_00;
  void *__src;
  uint uVar8;
  ulong __n;
  uint uVar9;
  undefined8 local_58;
  void *local_50;
  BufferHandle local_48;
  
  local_58 = string.value._0_8_;
  local_50 = string.value._8_8_;
  pBVar5 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  pBVar1 = pBVar5->buffer_manager;
  bVar3 = BufferHandle::IsValid(&this->handle);
  if (!bVar3) {
    (*pBVar1->_vptr_BufferManager[5])(&local_48,pBVar1,8,pBVar5,1);
    BufferHandle::operator=(&this->handle,&local_48);
    BufferHandle::~BufferHandle(&local_48);
  }
  if (this->block_id != -1) {
    iVar7 = this->offset;
    iVar6 = GetStringSpace(this);
    if (iVar7 + 8 < iVar6) goto LAB_017619c8;
  }
  iVar4 = (*pBVar5->_vptr_BlockManager[4])(pBVar5);
  AllocateNewBlock(this,state,CONCAT44(extraout_var,iVar4));
LAB_017619c8:
  *result_block = this->block_id;
  *result_offset = (int32_t)this->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar2 = ((this->handle).node.ptr)->buffer;
  *(uint *)(pdVar2 + this->offset) = (uint)local_58;
  this->offset = this->offset + 4;
  if ((uint)local_58 != 0) {
    __src = string.value._8_8_;
    uVar9 = (uint)local_58;
    if ((uint)local_58 < 0xd) {
      __src = (void *)((long)&local_58 + 4);
    }
    while( true ) {
      iVar7 = GetStringSpace(this);
      uVar8 = (int)iVar7 - (int)this->offset;
      if (uVar8 != 0) {
        if (uVar9 < uVar8) {
          uVar8 = uVar9;
        }
        __n = (ulong)uVar8;
        switchD_01602a8a::default(pdVar2 + this->offset,__src,__n);
        uVar9 = uVar9 - uVar8;
        this->offset = this->offset + __n;
        __src = (void *)((long)__src + __n);
      }
      if (uVar9 == 0) break;
      iVar4 = (*pBVar5->_vptr_BlockManager[4])(pBVar5);
      AllocateNewBlock(this,state,CONCAT44(extraout_var_00,iVar4));
    }
  }
  return;
}

Assistant:

void WriteOverflowStringsToDisk::WriteString(UncompressedStringSegmentState &state, string_t string,
                                             block_id_t &result_block, int32_t &result_offset) {
	auto &block_manager = partial_block_manager.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	if (!handle.IsValid()) {
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, &block_manager);
	}
	// first write the length of the string
	if (block_id == INVALID_BLOCK || offset + 2 * sizeof(uint32_t) >= GetStringSpace()) {
		AllocateNewBlock(state, block_manager.GetFreeBlockId());
	}
	result_block = block_id;
	result_offset = UnsafeNumericCast<int32_t>(offset);

	// write the length field
	auto data_ptr = handle.Ptr();
	auto string_length = string.GetSize();
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string_length), data_ptr + offset);
	offset += sizeof(uint32_t);

	// now write the remainder of the string
	auto strptr = string.GetData();
	auto remaining = UnsafeNumericCast<uint32_t>(string_length);
	while (remaining > 0) {
		uint32_t to_write = MinValue<uint32_t>(remaining, UnsafeNumericCast<uint32_t>(GetStringSpace() - offset));
		if (to_write > 0) {
			memcpy(data_ptr + offset, strptr, to_write);

			remaining -= to_write;
			offset += to_write;
			strptr += to_write;
		}
		if (remaining > 0) {
			D_ASSERT(offset == GetStringSpace());
			// there is still remaining stuff to write
			// now write the current block to disk and allocate a new block
			AllocateNewBlock(state, block_manager.GetFreeBlockId());
		}
	}
}